

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::hufUncompress(char *compressed,int nCompressed,unsigned_short *raw,int nRaw)

{
  uint im;
  uint iM;
  bool bVar1;
  char *in;
  reference pvVar2;
  reference pvVar3;
  uchar *b;
  vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> hdec;
  vector<long_long,_std::allocator<long_long>_> freq;
  char *ptr;
  allocator_type local_7d;
  int local_7c;
  long local_78;
  _Vector_base<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> local_70;
  _Vector_base<long_long,_std::allocator<long_long>_> local_58;
  unsigned_short *local_40;
  char *local_38;
  
  if (nCompressed != 0) {
    im = *(uint *)compressed;
    iM = *(uint *)(compressed + 4);
    if (iM < 0x10001 && im < 0x10001) {
      local_78 = (long)*(int *)(compressed + 0xc);
      local_38 = compressed + 0x14;
      std::vector<long_long,_std::allocator<long_long>_>::vector
                ((vector<long_long,_std::allocator<long_long>_> *)&local_58,0x10001,
                 (allocator_type *)&local_70);
      std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::vector
                ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)&local_70,0x4000,
                 &local_7d);
      local_7c = nRaw;
      local_40 = raw;
      pvVar2 = std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::at
                         ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)&local_70,0);
      hufClearDecTable(pvVar2);
      pvVar3 = std::vector<long_long,_std::allocator<long_long>_>::at
                         ((vector<long_long,_std::allocator<long_long>_> *)&local_58,0);
      hufUnpackEncTable(&local_38,nCompressed + -0x14,im,iM,pvVar3);
      in = local_38;
      bVar1 = local_78 <= (long)(compressed + ((long)nCompressed - (long)local_38)) * 8;
      if (local_78 <= (long)(compressed + ((long)nCompressed - (long)local_38)) * 8) {
        pvVar3 = std::vector<long_long,_std::allocator<long_long>_>::at
                           ((vector<long_long,_std::allocator<long_long>_> *)&local_58,0);
        pvVar2 = std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::at
                           ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)&local_70,0
                           );
        hufBuildDecTable(pvVar3,im,iM,pvVar2);
        pvVar3 = std::vector<long_long,_std::allocator<long_long>_>::at
                           ((vector<long_long,_std::allocator<long_long>_> *)&local_58,0);
        pvVar2 = std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::at
                           ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)&local_70,0
                           );
        hufDecode(pvVar3,pvVar2,in,(int)local_78,iM,local_7c,local_40);
        pvVar2 = std::vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::at
                           ((vector<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_> *)&local_70,0
                           );
        hufFreeDecTable(pvVar2);
      }
      std::_Vector_base<tinyexr::HufDec,_std::allocator<tinyexr::HufDec>_>::~_Vector_base(&local_70)
      ;
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base(&local_58);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool hufUncompress(const char compressed[], int nCompressed,
                   unsigned short raw[], int nRaw) {
  if (nCompressed == 0) {
    if (nRaw != 0) return false;

    return false;
  }

  int im = readUInt(compressed);
  int iM = readUInt(compressed + 4);
  // int tableLength = readUInt (compressed + 8);
  int nBits = readUInt(compressed + 12);

  if (im < 0 || im >= HUF_ENCSIZE || iM < 0 || iM >= HUF_ENCSIZE) return false;

  const char *ptr = compressed + 20;

  //
  // Fast decoder needs at least 2x64-bits of compressed data, and
  // needs to be run-able on this platform. Otherwise, fall back
  // to the original decoder
  //

  // if (FastHufDecoder::enabled() && nBits > 128)
  //{
  //    FastHufDecoder fhd (ptr, nCompressed - (ptr - compressed), im, iM, iM);
  //    fhd.decode ((unsigned char*)ptr, nBits, raw, nRaw);
  //}
  // else
  {
    std::vector<long long> freq(HUF_ENCSIZE);
    std::vector<HufDec> hdec(HUF_DECSIZE);

    hufClearDecTable(&hdec.at(0));

    hufUnpackEncTable(&ptr, nCompressed - (ptr - compressed), im, iM,
                      &freq.at(0));

    {
      if (nBits > 8 * (nCompressed - (ptr - compressed))) {
        return false;
      }

      hufBuildDecTable(&freq.at(0), im, iM, &hdec.at(0));
      hufDecode(&freq.at(0), &hdec.at(0), ptr, nBits, iM, nRaw, raw);
    }
    // catch (...)
    //{
    //    hufFreeDecTable (hdec);
    //    throw;
    //}

    hufFreeDecTable(&hdec.at(0));
  }

  return true;
}